

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall xe::TestSet::add(TestSet *this,TestNode *node)

{
  TestNodeType TVar1;
  deBool dVar2;
  Error *this_00;
  bool bVar3;
  TestNode *node_local;
  TestSet *this_local;
  
  TVar1 = TestNode::getNodeType(node);
  if (TVar1 == TESTNODETYPE_TEST_CASE) {
    addCase(this,(TestCase *)node);
  }
  else {
    do {
      dVar2 = deGetFalse();
      bVar3 = false;
      if (dVar2 == 0) {
        TVar1 = TestNode::getNodeType(node);
        bVar3 = true;
        if (TVar1 != TESTNODETYPE_GROUP) {
          TVar1 = TestNode::getNodeType(node);
          bVar3 = TVar1 == TESTNODETYPE_ROOT;
        }
      }
      if (!bVar3) {
        this_00 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(this_00,(char *)0x0,
                     "node->getNodeType() == TESTNODETYPE_GROUP || node->getNodeType() == TESTNODETYPE_ROOT"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                     ,0x17d);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    addGroup(this,(TestGroup *)node);
  }
  return;
}

Assistant:

void TestSet::add (const TestNode* node)
{
	if (node->getNodeType() == TESTNODETYPE_TEST_CASE)
		addCase(static_cast<const TestCase*>(node));
	else
	{
		XE_CHECK(node->getNodeType() == TESTNODETYPE_GROUP ||
				  node->getNodeType() == TESTNODETYPE_ROOT);
		addGroup(static_cast<const TestGroup*>(node));
	}
}